

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testComparators<Imath_3_2::Vec2<double>>(char *type)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  Box<Imath_3_2::Vec2<double>_> *src;
  Box<Imath_3_2::Vec2<double>_> *pBVar6;
  Vec2<double> *maxT;
  Vec2<double> *pVVar7;
  char *in_RDI;
  Box<Imath_3_2::Vec2<double>_> b2;
  Box<Imath_3_2::Vec2<double>_> b1_2;
  Box<Imath_3_2::Vec2<double>_> b0_2;
  Vec2<double> p3;
  Vec2<double> p2;
  Vec2<double> p1_1;
  Vec2<double> p0_1;
  uint j_1;
  uint i_1;
  vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_> perms_1;
  Box<Imath_3_2::Vec2<double>_> b1_1;
  Box<Imath_3_2::Vec2<double>_> b0_1;
  Vec2<double> p1;
  Vec2<double> p0;
  uint j;
  uint i;
  vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_> perms;
  Box<Imath_3_2::Vec2<double>_> b1;
  Box<Imath_3_2::Vec2<double>_> b0;
  Rand32 rand;
  Vec2<double> *in_stack_fffffffffffffe28;
  Box<Imath_3_2::Vec2<double>_> *in_stack_fffffffffffffe30;
  Box<Imath_3_2::Vec2<double>_> *in_stack_fffffffffffffe38;
  Box<Imath_3_2::Vec2<double>_> *in_stack_fffffffffffffe40;
  Box<Imath_3_2::Vec2<double>_> *this;
  vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>
  *in_stack_fffffffffffffe70;
  Vec2<double> local_140 [2];
  Vec2<double> local_120 [2];
  uint local_100;
  uint local_fc;
  Box<Imath_3_2::Vec2<double>_> local_f8 [2];
  Vec2<double> local_a0 [2];
  uint local_7c;
  uint local_78;
  vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_> local_68 [4];
  char *local_8;
  
  local_8 = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"    comparators for type ");
  poVar2 = std::operator<<(poVar2,local_8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Rand32::Rand32
            ((Rand32 *)in_stack_fffffffffffffe30,(unsigned_long)in_stack_fffffffffffffe28);
  Imath_3_2::Box<Imath_3_2::Vec2<double>_>::Box(in_stack_fffffffffffffe30);
  Imath_3_2::Box<Imath_3_2::Vec2<double>_>::Box(in_stack_fffffffffffffe30);
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<double>_>::operator==
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  if (!bVar1) {
    __assert_fail("b0 == b1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x179,
                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<double>]"
                 );
  }
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<double>_>::operator!=
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!(b0 != b1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x17a,
                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<double>]"
                 );
  }
  std::vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>::vector
            ((vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_> *)0x11ae68)
  ;
  permutations<Imath_3_2::Vec2<double>>(in_stack_fffffffffffffe70);
  for (local_78 = 0; uVar3 = (ulong)local_78,
      sVar4 = std::vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>::size
                        (local_68), uVar3 < sVar4; local_78 = local_78 + 1) {
    for (local_7c = 0; uVar3 = (ulong)local_7c,
        sVar4 = std::vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>::
                size(local_68), uVar3 < sVar4; local_7c = local_7c + 1) {
      std::vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>::operator[]
                (local_68,(ulong)local_78);
      Imath_3_2::Vec2<double>::operator-(in_stack_fffffffffffffe28);
      pvVar5 = std::vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>::
               operator[](local_68,(ulong)local_7c);
      Imath_3_2::Vec2<double>::Vec2(local_a0,pvVar5);
      Imath_3_2::Box<Imath_3_2::Vec2<double>_>::Box(in_stack_fffffffffffffe30);
      Imath_3_2::Box<Imath_3_2::Vec2<double>_>::Box
                (in_stack_fffffffffffffe40,&in_stack_fffffffffffffe38->min,
                 &in_stack_fffffffffffffe30->min);
      bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<double>_>::operator==
                        (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("!(b0 == b1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                      ,0x18d,
                      "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<double>]"
                     );
      }
      bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<double>_>::operator!=
                        (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      if (!bVar1) {
        __assert_fail("b0 != b1",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                      ,0x18e,
                      "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<double>]"
                     );
      }
    }
  }
  std::vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>::~vector
            ((vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_> *)
             in_stack_fffffffffffffe40);
  this = local_f8;
  std::vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>::vector
            ((vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_> *)0x11b043)
  ;
  permutations<Imath_3_2::Vec2<double>>(in_stack_fffffffffffffe70);
  local_fc = 0;
  do {
    src = (Box<Imath_3_2::Vec2<double>_> *)(ulong)local_fc;
    pBVar6 = (Box<Imath_3_2::Vec2<double>_> *)
             std::vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>::size
                       ((vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>
                         *)local_f8);
    if (pBVar6 <= src) {
      std::vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>::~vector
                ((vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_> *)this)
      ;
      return;
    }
    local_100 = 0;
    while( true ) {
      maxT = (Vec2<double> *)(ulong)local_100;
      pVVar7 = (Vec2<double> *)
               std::vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>::size
                         ((vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>
                           *)local_f8);
      if (pVVar7 <= maxT) break;
      std::vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>::operator[]
                ((vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_> *)
                 local_f8,(ulong)local_fc);
      Imath_3_2::Vec2<double>::operator-(in_stack_fffffffffffffe28);
      pvVar5 = std::vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>::
               operator[]((vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>
                           *)local_f8,(ulong)local_100);
      Imath_3_2::Vec2<double>::Vec2(local_120,pvVar5);
      std::vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>::operator[]
                ((vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_> *)
                 local_f8,(ulong)local_100);
      Imath_3_2::Vec2<double>::operator-(in_stack_fffffffffffffe28);
      pvVar5 = std::vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>::
               operator[]((vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>
                           *)local_f8,(ulong)local_fc);
      Imath_3_2::Vec2<double>::Vec2(local_140,pvVar5);
      Imath_3_2::Box<Imath_3_2::Vec2<double>_>::Box(this,&src->min,maxT);
      Imath_3_2::Box<Imath_3_2::Vec2<double>_>::Box(this,&src->min,maxT);
      Imath_3_2::Box<Imath_3_2::Vec2<double>_>::Box(this,&src->min,maxT);
      if (local_fc == local_100) {
        bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<double>_>::operator==(this,src);
        if (!bVar1) {
          __assert_fail("b0 == b1",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                        ,0x1aa,
                        "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<double>]"
                       );
        }
        bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<double>_>::operator!=(this,src);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          __assert_fail("!(b0 != b1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                        ,0x1ab,
                        "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<double>]"
                       );
        }
      }
      else {
        bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<double>_>::operator!=(this,src);
        if (!bVar1) {
          __assert_fail("b0 != b1",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                        ,0x1af,
                        "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<double>]"
                       );
        }
        bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<double>_>::operator==(this,src);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          __assert_fail("!(b0 == b1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                        ,0x1b0,
                        "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<double>]"
                       );
        }
      }
      bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<double>_>::operator==(this,src);
      if (!bVar1) {
        __assert_fail("b0 == b2",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                      ,0x1b2,
                      "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<double>]"
                     );
      }
      bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<double>_>::operator!=(this,src);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("!(b0 != b2)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                      ,0x1b3,
                      "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<double>]"
                     );
      }
      local_100 = local_100 + 1;
    }
    local_fc = local_fc + 1;
  } while( true );
}

Assistant:

void
testComparators (const char* type)
{
    cout << "    comparators for type " << type << endl;

    IMATH_INTERNAL_NAMESPACE::Rand32 rand (0);

    //
    // Compare empty.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0;
        IMATH_INTERNAL_NAMESPACE::Box<T> b1;

        assert (b0 == b1);
        assert (!(b0 != b1));
    }

    //
    // Compare empty to non-empty.
    //
    {
        std::vector<T> perms;
        permutations (perms);

        for (unsigned int i = 0; i < perms.size (); i++)
        {
            for (unsigned int j = 0; j < perms.size (); j++)
            {
                T p0 = -perms[i];
                T p1 = perms[j];

                IMATH_INTERNAL_NAMESPACE::Box<T> b0;
                IMATH_INTERNAL_NAMESPACE::Box<T> b1 (p0, p1);
                assert (!(b0 == b1));
                assert (b0 != b1);
            }
        }
    }

    //
    // Compare two non-empty
    //
    {
        std::vector<T> perms;
        permutations (perms);

        for (unsigned int i = 0; i < perms.size (); i++)
        {
            for (unsigned int j = 0; j < perms.size (); j++)
            {
                T p0 = -perms[i];
                T p1 = perms[j];

                T p2 = -perms[j];
                T p3 = perms[i];

                IMATH_INTERNAL_NAMESPACE::Box<T> b0 (p0, p1);
                IMATH_INTERNAL_NAMESPACE::Box<T> b1 (p2, p3);
                IMATH_INTERNAL_NAMESPACE::Box<T> b2 (p0, p1);

                if (i == j)
                {
                    assert (b0 == b1);
                    assert (!(b0 != b1));
                }
                else
                {
                    assert (b0 != b1);
                    assert (!(b0 == b1));
                }
                assert (b0 == b2);
                assert (!(b0 != b2));
            }
        }
    }
}